

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O0

void nn_rw_loop(nn_options_t *options,int sock)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  int *piVar4;
  uint64_t uVar5;
  long lVar6;
  int64_t recv_timeout;
  int64_t interval;
  int64_t time_to_sleep;
  uint64_t start_time;
  void *buf;
  int rc;
  int sock_local;
  nn_options_t *options_local;
  
  lVar1 = (long)(int)(options->send_interval * 1000.0);
  lVar2 = (long)(int)(options->recv_timeout * 1000.0);
  buf._4_4_ = sock;
  _rc = options;
  do {
    uVar3 = nn_clock_ms();
    buf._0_4_ = nn_send(buf._4_4_,(_rc->data_to_send).data,(long)(_rc->data_to_send).length,0);
    if (((int)buf < 0) && (piVar4 = __errno_location(), *piVar4 == 0xb)) {
      fprintf(_stderr,"Message not sent (EAGAIN)\n");
    }
    else {
      nn_assert_errno((uint)(-1 < (int)buf),"Can\'t send");
    }
    if (_rc->send_interval <= 0.0 && _rc->send_interval != 0.0) {
      nn_recv_loop(_rc,buf._4_4_);
      return;
    }
LAB_00103eee:
    uVar5 = nn_clock_ms();
    interval = (uVar3 + lVar1) - uVar5;
    if (0 < interval) {
      if ((-1 < lVar2) && (lVar2 < interval)) {
        interval = lVar2;
      }
      nn_set_recv_timeout(buf._4_4_,(int)interval);
      buf._0_4_ = nn_recv(buf._4_4_,&start_time,0xffffffffffffffff,0);
      if ((int)buf < 0) break;
      goto LAB_00103fbb;
    }
  } while( true );
  piVar4 = __errno_location();
  if (*piVar4 != 0xb) {
    piVar4 = __errno_location();
    if ((*piVar4 == 0x6e) || (piVar4 = __errno_location(), *piVar4 == 0x9523dfe)) {
      uVar5 = nn_clock_ms();
      lVar6 = (uVar3 + lVar1) - uVar5;
      if (0 < lVar6) {
        nn_sleep((int)lVar6);
      }
    }
    else {
LAB_00103fbb:
      nn_assert_errno((uint)(-1 < (int)buf),"Can\'t recv");
      nn_print_message(_rc,(char *)start_time,(int)buf);
      nn_freemsg(start_time);
    }
  }
  goto LAB_00103eee;
}

Assistant:

void nn_rw_loop (nn_options_t *options, int sock)
{
    int rc;
    void *buf;
    uint64_t start_time;
    int64_t time_to_sleep, interval, recv_timeout;

    interval = (int)(options->send_interval*1000);
    recv_timeout = (int)(options->recv_timeout*1000);

    for (;;) {
        start_time = nn_clock_ms();
        rc = nn_send (sock,
            options->data_to_send.data, options->data_to_send.length,
            0);
        if (rc < 0 && errno == EAGAIN) {
            fprintf (stderr, "Message not sent (EAGAIN)\n");
        } else {
            nn_assert_errno (rc >= 0, "Can't send");
        }
        if (options->send_interval < 0) {  /*  Never send any more  */
            nn_recv_loop (options, sock);
            return;
        }

        for (;;) {
            time_to_sleep = (start_time + interval) - nn_clock_ms();
            if (time_to_sleep <= 0) {
                break;
            }
            if (recv_timeout >= 0 && time_to_sleep > recv_timeout)
            {
                time_to_sleep = recv_timeout;
            }
            nn_set_recv_timeout (sock, (int) time_to_sleep);
            rc = nn_recv (sock, &buf, NN_MSG, 0);
            if (rc < 0) {
                if (errno == EAGAIN) {
                    continue;
                } else if (errno == ETIMEDOUT || errno == EFSM) {
                    time_to_sleep = (start_time + interval) - nn_clock_ms();
                    if (time_to_sleep > 0)
                        nn_sleep ((int) time_to_sleep);
                    continue;
                }
            }
            nn_assert_errno (rc >= 0, "Can't recv");
            nn_print_message (options, buf, rc);
            nn_freemsg (buf);
        }
    }
}